

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> __thiscall
qclab::dense::init_unique_array<std::complex<double>>(dense *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  complex<double> *__p;
  pointer pcVar3;
  complex<double> *local_60;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> local_20;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> mem;
  int64_t size_local;
  
  mem._M_t.super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
  ._M_t.super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )size;
  if (size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                  ,0x1e,
                  "auto qclab::dense::init_unique_array(const int64_t) [T = std::complex<double>]");
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __p = (complex<double> *)operator_new__(uVar2);
  if (size != 0) {
    local_60 = __p;
    do {
      std::complex<double>::complex(local_60,0.0,0.0);
      local_60 = local_60 + 1;
    } while (local_60 != __p + size);
  }
  std::unique_ptr<std::complex<double>[],std::default_delete<std::complex<double>[]>>::
  unique_ptr<std::complex<double>*,std::default_delete<std::complex<double>[]>,void,bool>
            ((unique_ptr<std::complex<double>[],std::default_delete<std::complex<double>[]>> *)
             &local_20,__p);
  pcVar3 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           get(&local_20);
  if (pcVar3 != (pointer)0x0) {
    std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
    unique_ptr((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
               this,&local_20);
    std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
    ~unique_ptr(&local_20);
    return (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
            )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
              )this;
  }
  __assert_fail("mem.get() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x20,
                "auto qclab::dense::init_unique_array(const int64_t) [T = std::complex<double>]");
}

Assistant:

inline auto init_unique_array( const int64_t size ) {
      assert( size > 0 ) ;
      std::unique_ptr< T[] > mem( new T[size]() ) ;
      assert( mem.get() != nullptr ) ;
      return mem ;
    }